

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_chdir(Context *context,IntrinsicResult partialResult)

{
  TextOutputMethod *pp_Var1;
  int iVar2;
  long *plVar3;
  undefined4 *puVar4;
  bool b;
  Value path;
  String pathStr;
  Value local_78;
  Value local_68;
  long *local_58;
  char local_50;
  undefined1 local_48 [16];
  Interpreter *local_38;
  anon_union_8_3_2f476f46_for_data local_30 [3];
  
  local_50 = '\0';
  plVar3 = (long *)operator_new(0x30);
  plVar3[1] = 1;
  *plVar3 = (long)&PTR__StringStorage_001bf0d8;
  plVar3[3] = 5;
  plVar3[4] = -1;
  puVar4 = (undefined4 *)operator_new__(5);
  plVar3[2] = (long)puVar4;
  *(undefined1 *)(puVar4 + 1) = 0;
  *puVar4 = 0x68746170;
  local_58 = plVar3;
  MiniScript::Context::GetVar
            ((Context *)local_48,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  if ((local_58 != (long *)0x0) && (local_50 == '\0')) {
    plVar3 = local_58 + 1;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
  }
  if (local_48[0] == 0) {
    local_78.type = MiniScript::Value::zero;
    local_78.noInvoke = DAT_001c12e1;
    local_78.localOnly = DAT_001c12e2;
    local_78.data.ref = DAT_001c12e8;
    if (DAT_001c12e8 != (RefCountedStorage *)0x0 && Temp < MiniScript::Value::zero) {
      DAT_001c12e8->refCount = DAT_001c12e8->refCount + 1;
    }
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               &local_78);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_78.type) && (local_78.data.ref != (RefCountedStorage *)0x0)) {
      plVar3 = &(local_78.data.ref)->refCount;
      *plVar3 = *plVar3 + -1;
      if (*plVar3 == 0) {
        (*(local_78.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_78.data.number = 0.0;
    }
  }
  else {
    MiniScript::Value::ToString((Value *)&local_38,(Machine *)local_48);
    if ((local_38 == (Interpreter *)0x0) || (local_38->errorOutput < (TextOutputMethod)0x2)) {
      b = false;
    }
    else {
      iVar2 = chdir((char *)local_38->implicitOutput);
      b = iVar2 == 0;
    }
    MiniScript::Value::Truth(&local_68,b);
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               &local_68);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_68.type) && (local_68.data.ref != (RefCountedStorage *)0x0)) {
      plVar3 = &(local_68.data.ref)->refCount;
      *plVar3 = *plVar3 + -1;
      if (*plVar3 == 0) {
        (*(local_68.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_68.data.number = 0.0;
    }
    if ((local_38 != (Interpreter *)0x0) && ((undefined1)local_30[0].tempNum == '\0')) {
      pp_Var1 = &local_38->standardOutput;
      *pp_Var1 = *pp_Var1 + -1;
      if (*pp_Var1 == (TextOutputMethod)0x0) {
        (*local_38->_vptr_Interpreter[1])();
      }
    }
  }
  if ((2 < local_48[0]) && ((long *)local_48._8_8_ != (long *)0x0)) {
    plVar3 = (long *)(local_48._8_8_ + 8);
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (**(code **)(*(long *)local_48._8_8_ + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_chdir(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::zero);
	String pathStr = path.ToString();
	bool ok = false;
	if (!pathStr.empty()) {
		if (chdir(pathStr.c_str()) == 0) ok = true;
	}
	return IntrinsicResult(Value::Truth(ok));
}